

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial2.hpp
# Opt level: O0

void BruteForceTexture(int x,int y,int samps)

{
  bool bVar1;
  reference ppVar2;
  int in_EDX;
  double dVar3;
  int Nnew;
  int Nold;
  float scale;
  double x_2;
  Vector *p;
  pair<Vector,_Vector> *elem;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_> *__range3;
  Vector hitp;
  int id;
  double t_1;
  Ray ray;
  Vector d_1;
  float _r;
  int i;
  int x_1;
  float max_temp;
  int y_1;
  float max_ref;
  PosFilter filter;
  Vector d;
  float dy;
  float dx;
  int s;
  Random rng;
  int t;
  int nthread;
  vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_> _filter_elems;
  vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>
  *in_stack_fffffffffffffd28;
  Random *in_stack_fffffffffffffd30;
  value_type *in_stack_fffffffffffffd38;
  Vector *in_stack_fffffffffffffd40;
  Ray *in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  __normal_iterator<std::pair<Vector,_Vector>_*,_std::vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>_>
  local_248;
  undefined1 *local_240;
  Ray local_1f8 [3];
  Vector local_168;
  float local_150;
  int local_14c;
  uint local_148;
  float local_144;
  int local_140;
  float local_13c;
  Ray local_138 [2];
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  Random *in_stack_ffffffffffffff58;
  Ray *in_stack_ffffffffffffff60;
  Vector local_78;
  float local_60;
  float local_5c;
  int local_58;
  int local_30;
  int local_2c;
  undefined1 local_28 [28];
  int local_c;
  
  local_c = in_EDX;
  std::vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>::vector
            ((vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_> *)
             0x1336b9);
  local_2c = std::thread::hardware_concurrency();
  for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
    clock();
    Random::Random(in_stack_fffffffffffffd30,(uint)((ulong)in_stack_fffffffffffffd28 >> 0x20));
    for (local_58 = 0; local_58 < local_c / local_2c; local_58 = local_58 + 1) {
      dVar3 = Random::operator()((Random *)0x13375e);
      local_5c = (float)dVar3;
      dVar3 = Random::operator()((Random *)0x133786);
      local_60 = (float)dVar3;
      operator*(in_stack_fffffffffffffd40,(double)in_stack_fffffffffffffd38);
      operator*(in_stack_fffffffffffffd40,(double)in_stack_fffffffffffffd38);
      operator+(in_stack_fffffffffffffd40,&in_stack_fffffffffffffd38->first);
      operator+(in_stack_fffffffffffffd40,&in_stack_fffffffffffffd38->first);
      Vector::Normalize(in_stack_fffffffffffffd40);
      Ray::Ray(local_138,&cam.o,&local_78);
      indirect_filter(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                      in_stack_ffffffffffffff50);
      std::vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>::push_back
                ((vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_> *)
                 in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    }
  }
  local_13c = 0.0;
  for (local_140 = 0; local_140 < height; local_140 = local_140 + 1) {
    local_144 = 0.0;
    for (local_148 = 0; (int)local_148 < width; local_148 = local_148 + 1) {
      local_14c = (~local_148 + width) * height + local_140;
      local_150 = 0.0;
      operator*(in_stack_fffffffffffffd40,(double)in_stack_fffffffffffffd38);
      operator*(in_stack_fffffffffffffd40,(double)in_stack_fffffffffffffd38);
      operator+(in_stack_fffffffffffffd40,&in_stack_fffffffffffffd38->first);
      operator+(in_stack_fffffffffffffd40,&in_stack_fffffffffffffd38->first);
      Vector::Normalize(in_stack_fffffffffffffd40);
      Ray::Ray(local_1f8,&cam.o,&local_168);
      in_stack_fffffffffffffd57 =
           Intersect((vector<Sphere,_std::allocator<Sphere>_> *)
                     CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                     in_stack_fffffffffffffd48,&in_stack_fffffffffffffd40->x,
                     (int *)in_stack_fffffffffffffd38);
      if ((bool)in_stack_fffffffffffffd57) {
        in_stack_fffffffffffffd48 = local_1f8;
        operator*((double)in_stack_fffffffffffffd40,&in_stack_fffffffffffffd38->first);
        operator+(in_stack_fffffffffffffd40,&in_stack_fffffffffffffd38->first);
        local_240 = local_28;
        local_248._M_current =
             (pair<Vector,_Vector> *)
             std::vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>::
             begin(in_stack_fffffffffffffd28);
        std::vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>::end
                  (in_stack_fffffffffffffd28);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::pair<Vector,_Vector>_*,_std::vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>_>
                                   *)in_stack_fffffffffffffd30,
                                  (__normal_iterator<std::pair<Vector,_Vector>_*,_std::vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>_>
                                   *)in_stack_fffffffffffffd28), bVar1) {
          ppVar2 = __gnu_cxx::
                   __normal_iterator<std::pair<Vector,_Vector>_*,_std::vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>_>
                   ::operator*(&local_248);
          operator-(in_stack_fffffffffffffd40,&in_stack_fffffffffffffd38->first);
          in_stack_fffffffffffffd40 = (Vector *)Vector::Norm((Vector *)0x133bc7);
          in_stack_fffffffffffffd38 = (value_type *)(double)(0.3989423 / filterRadius);
          dVar3 = pow((double)in_stack_fffffffffffffd40 / (double)filterRadius,2.0);
          dVar3 = exp(dVar3 * -0.5);
          local_150 = (float)((double)in_stack_fffffffffffffd38 * dVar3 * (ppVar2->second).x +
                             (double)local_150);
          __gnu_cxx::
          __normal_iterator<std::pair<Vector,_Vector>_*,_std::vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>_>
          ::operator++(&local_248);
        }
        ref_img[local_14c] =
             (ref_img[local_14c] * (float)(nPassesFilter * local_c) + local_150 * 20.0) /
             (float)((nPassesFilter + 1) * local_c);
        in_stack_fffffffffffffd30 = (Random *)std::max<float>(ref_img + local_14c,&local_144);
        local_144 = *(float *)&(in_stack_fffffffffffffd30->_gen)._M_x;
      }
    }
    in_stack_fffffffffffffd28 =
         (vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_> *)
         std::max<float>(&local_13c,&local_144);
    local_13c = *(float *)&(in_stack_fffffffffffffd28->
                           super__Vector_base<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
  }
  ref_scale = 1.0 / local_13c;
  dVar3 = sqrt(((double)nPassesFilter + 0.8) / ((double)nPassesFilter + 1.0));
  filterRadius = (float)((double)filterRadius * dVar3);
  nPassesFilter = nPassesFilter + 1;
  std::vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_>::~vector
            ((vector<std::pair<Vector,_Vector>,_std::allocator<std::pair<Vector,_Vector>_>_> *)
             in_stack_fffffffffffffd40);
  return;
}

Assistant:

void BruteForceTexture(int x, int y, int samps = 1000) {

   std::vector<PosFilter> _filter_elems;

   // Sub pixel sampling
   const int nthread = std::thread::hardware_concurrency();
   #pragma omp parallel for schedule(dynamic, 1)
   for(int t=0; t<nthread; ++t) {
      Random rng(t + nthread*clock());

      for(int s=0; s<samps/nthread; s++){

         // Create the RNG and get the sub-pixel sample
         float dx = rng();
         float dy = rng();

         // Generate the pixel direction
         Vector d = cx*((dx + x)/width  - .5) +
                    cy*((dy + y)/height - .5) + cam.d;
         d.Normalize();

         // Evaluate the Covariance and Radiance at the pixel location
         const auto filter = indirect_filter(Ray(cam.o, d), rng, 0, 1);
         #pragma omp critical
         {
            _filter_elems.push_back(filter);
         }
      }
   }

   // Loop over the rows and columns of the image and evaluate radiance and
   // covariance per pixel using Monte-Carlo.
   float max_ref = 0.0f;
   #pragma omp parallel for schedule(dynamic, 1), shared(max_ref)
   for (int y=0; y<height; y++){
      float max_temp = 0.0f;

      for (int x=0; x<width; x++) {
         int i=(width-x-1)*height+y;
         float _r = 0.0f;

         // Generate the pixel direction
         Vector d = cx*((0.5 + x)/width  - .5) +
                    cy*((0.5 + y)/height - .5) + cam.d;
         d.Normalize();

         Ray ray(cam.o, d);
         double t; int id;
         if(!Intersect(spheres, ray, t, id)){ continue; }
         Vector hitp = ray.o + t*ray.d;

         for(auto& elem : _filter_elems) {
            const auto& p = elem.first;
            const auto  x = Vector::Norm(hitp-p) / filterRadius;
            _r += (0.3989422804f/filterRadius) * exp(-0.5f * pow(x, 2)) * elem.second.x;
         }

         const auto scale = 20.f;
         const auto Nold  = nPassesFilter * samps;
         const auto Nnew  = (nPassesFilter+1) * samps;
         ref_img[i] = (ref_img[i]*Nold + scale*_r) / float(Nnew);
         max_temp   = std::max(ref_img[i], max_temp);
      }

      #pragma omp critical
      {
         max_ref = std::max(max_ref, max_temp);
      }
   }

   // Update the scaling
   ref_scale = 1.0f/max_ref;

   // Progressive refinement of the radius and number of passes
   filterRadius *= sqrt((nPassesFilter + 0.8) / (nPassesFilter + 1.0));
   ++nPassesFilter;
}